

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall kj::TaskSet::~TaskSet(TaskSet *this)

{
  TaskSet *this_local;
  
  Maybe<kj::Own<kj::PromiseFulfiller<void>_>_>::~Maybe(&this->emptyFulfiller);
  Maybe<kj::Own<kj::TaskSet::Task>_>::~Maybe(&this->tasks);
  return;
}

Assistant:

TaskSet::~TaskSet() noexcept(false) {}